

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O0

EStatusCode __thiscall Type1Input::Type1Seac(Type1Input *this,LongList *inOperandList)

{
  CharString1Dependencies *pCVar1;
  size_type sVar2;
  Trace *this_00;
  reference plVar3;
  pair<std::_Rb_tree_const_iterator<unsigned_char>,_bool> pVar4;
  value_type_conflict3 local_41;
  _Base_ptr local_40;
  undefined1 local_38;
  value_type_conflict3 local_29;
  const_reverse_iterator it;
  LongList *inOperandList_local;
  Type1Input *this_local;
  
  it.current._M_node = (_List_const_iterator<long>)(_List_const_iterator<long>)inOperandList;
  sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
  if (sVar2 < 2) {
    this_00 = Trace::DefaultTrace();
    sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size
                      ((list<long,_std::allocator<long>_> *)it.current._M_node);
    Trace::TraceToLog(this_00,
                      "Type1Input::Type1Seac exception, there should be 2 parameters provided for seac operation but only %d provided"
                      ,sVar2);
    this_local._4_4_ = eFailure;
  }
  else {
    std::__cxx11::list<long,_std::allocator<long>_>::rbegin
              ((list<long,_std::allocator<long>_> *)&stack0xffffffffffffffd8);
    pCVar1 = this->mCurrentDependencies;
    plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*
                       ((reverse_iterator<std::_List_const_iterator<long>_> *)
                        &stack0xffffffffffffffd8);
    local_29 = (value_type_conflict3)*plVar3;
    pVar4 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
            insert(&pCVar1->mCharCodes,&local_29);
    local_40 = (_Base_ptr)pVar4.first._M_node;
    local_38 = pVar4.second;
    std::reverse_iterator<std::_List_const_iterator<long>_>::operator++
              ((reverse_iterator<std::_List_const_iterator<long>_> *)&stack0xffffffffffffffd8);
    pCVar1 = this->mCurrentDependencies;
    plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*
                       ((reverse_iterator<std::_List_const_iterator<long>_> *)
                        &stack0xffffffffffffffd8);
    local_41 = (value_type_conflict3)*plVar3;
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::insert
              (&pCVar1->mCharCodes,&local_41);
    this_local._4_4_ = eSuccess;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1Input::Type1Seac(const LongList& inOperandList)
{
	if(inOperandList.size() < 2) {
		TRACE_LOG1("Type1Input::Type1Seac exception, there should be 2 parameters provided for seac operation but only %d provided",inOperandList.size());
		return eFailure;		
	}

	LongList::const_reverse_iterator it = inOperandList.rbegin();

	mCurrentDependencies->mCharCodes.insert((Byte)*it);
	++it;
	mCurrentDependencies->mCharCodes.insert((Byte)*it);
	return eSuccess;
}